

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnSectionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,Index section_index)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  const_pointer pcVar4;
  undefined1 local_38 [8];
  string_view sym_name;
  Index section_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  sym_name.size_._4_4_ = section_index;
  _local_38 = BinaryReaderObjdumpBase::GetSectionName
                        (&this->super_BinaryReaderObjdumpBase,section_index);
  bVar1 = string_view::empty((string_view *)local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!sym_name.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-reader-objdump.cc"
                  ,0x738,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderObjdump::OnSectionSymbol(Index, uint32_t, Index)"
                 );
  }
  sVar3 = string_view::length((string_view *)local_38);
  pcVar4 = string_view::data((string_view *)local_38);
  PrintDetails(this,"   - %d: S <%.*s> section=%u",(ulong)index,sVar3 & 0xffffffff,pcVar4,
               (ulong)sym_name.size_._4_4_);
  RVar2 = PrintSymbolFlags(this,flags);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnSectionSymbol(Index index,
                                            uint32_t flags,
                                            Index section_index) {
  auto sym_name = GetSectionName(section_index);
  assert(!sym_name.empty());
  PrintDetails("   - %d: S <" PRIstringview "> section=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(sym_name), section_index);
  return PrintSymbolFlags(flags);
}